

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void dw3_female_pilgrim(dw_rom *rom)

{
  vpatch(rom,0x87da,2,0xe,0x1b);
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,3,0x36,0x30,0x11);
  vpatch(rom,0x12301,0x7f,0xf,0x1e,0x1f,0x10,0x1f,0x1f,0x3f,1,7,0x17,0x17,0x1f,10,0x12,0x38,0x60,
         0xf2,0x7d,0xfd,8,0xfa,0xfc,0xfe,0x80,0xe2,0xea,0xea,0xfa,0x52,0x4e,0x18,0x31,0x36,0x1d,0xe,
         0x1f,0xf,0,0,0x3f,0x2f,3,0x13,0x1f,0x3f,0x1f,0,0x8e,0x6c,0xa8,0x72,0xf2,2,0xf0,0xf0,0xf0,
         0xf6,0xfa,0xfa,0xfa,0xfa,0xfe,0,6,0xf);
  vpatch(rom,0x12400,0x180,3,7,0x2b,0x57,0x50,7,0x27,3,4,0xf,0x27,0x2f,0x2f,0x22,0x22,0x20,0xe0,0xf8
         ,0xf8,0xf8,0xf8,0x18,0xe0,0xf8,0x60,0xb8,0xb8,0xb8,0xd8,0xf8,0x38,0x78,2,0x37,0x3f,10,0x23,
         0x23,0x23,0,0x23,1,3,0x25,0x27,0x2b,0x2b,0x20,0x1c,0xcc,0xec,0x18,0xe0,0xf0,0x70,0xf0,0xfc,
         0xfc,0xfc,0xe8,0xf8,0xf8,0x74,0,3);
  return;
}

Assistant:

static void dw3_female_pilgrim(dw_rom *rom)
{
    vpatch(rom, 0x087da,    2,  0x0e,  0x1b); // his -> her
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x30,  0x11);
    vpatch(rom, 0x12301,  127,  0x0f,  0x1e,  0x1f,  0x10,  0x1f,  0x1f,  0x3f,  0x01,  0x07,  0x17,  0x17,  0x1f,  0x0a,  0x12,  0x38,  0x60,  0xf2,  0x7d,  0xfd,  0x08,  0xfa,  0xfc,  0xfe,  0x80,  0xe2,  0xea,  0xea,  0xfa,  0x52,  0x4e,  0x18,  0x31,  0x36,  0x1d,  0x0e,  0x1f,  0x0f,  0x00,  0x00,  0x3f,  0x2f,  0x03,  0x13,  0x1f,  0x3f,  0x1f,  0x00,  0x8e,  0x6c,  0xa8,  0x72,  0xf2,  0x02,  0xf0,  0xf0,  0xf0,  0xf6,  0xfa,  0xfa,  0xfa,  0xfa,  0xfe,  0x00,  0x06,  0x0f,  0x1e,  0x1f,  0x10,  0x1f,  0x1f,  0x3f,  0x01,  0x07,  0x17,  0x17,  0x1f,  0x0a,  0x12,  0x38,  0x60,  0xf0,  0x7a,  0xfd,  0x0d,  0xf0,  0xfa,  0xfc,  0x80,  0xe0,  0xea,  0xea,  0xfa,  0x52,  0x4a,  0x1e,  0x31,  0x26,  0x35,  0x2e,  0x0f,  0x00,  0x0f,  0x0f,  0x3f,  0x3f,  0x0f,  0x1f,  0x1f,  0x1f,  0x3f,  0x00,  0x8c,  0x6e,  0xae,  0x70,  0xf2,  0xf2,  0x02,  0x00,  0xf6,  0xf0,  0xf8,  0xfa,  0xfa,  0xfe,  0xfa,  0x02);
    vpatch(rom, 0x12400,  384,  0x03,  0x07,  0x2b,  0x57,  0x50,  0x07,  0x27,  0x03,  0x04,  0x0f,  0x27,  0x2f,  0x2f,  0x22,  0x22,  0x20,  0xe0,  0xf8,  0xf8,  0xf8,  0xf8,  0x18,  0xe0,  0xf8,  0x60,  0xb8,  0xb8,  0xb8,  0xd8,  0xf8,  0x38,  0x78,  0x02,  0x37,  0x3f,  0x0a,  0x23,  0x23,  0x23,  0x00,  0x23,  0x01,  0x03,  0x25,  0x27,  0x2b,  0x2b,  0x20,  0x1c,  0xcc,  0xec,  0x18,  0xe0,  0xf0,  0x70,  0xf0,  0xfc,  0xfc,  0xfc,  0xe8,  0xf8,  0xf8,  0x74,  0x00,  0x03,  0x17,  0x2b,  0x2f,  0x00,  0x17,  0x07,  0x03,  0x04,  0x1f,  0x17,  0x17,  0x1f,  0x12,  0x12,  0x10,  0xe0,  0xf8,  0xf8,  0xf8,  0xf8,  0x18,  0xe0,  0xf8,  0x60,  0xb8,  0xb8,  0xb8,  0xd8,  0xf8,  0x38,  0x78,  0x1a,  0x1b,  0x0f,  0x12,  0x13,  0x13,  0x03,  0x07,  0x03,  0x00,  0x11,  0x15,  0x17,  0x1b,  0x1b,  0x00,  0x1c,  0xcc,  0xec,  0x18,  0xe0,  0xf0,  0xb0,  0x80,  0xfc,  0xfc,  0xfc,  0xe8,  0xf8,  0xf8,  0xb4,  0x00,  0x07,  0x1f,  0x1f,  0x1f,  0x1f,  0x18,  0x07,  0x1f,  0x06,  0x1d,  0x1d,  0x1d,  0x1b,  0x1f,  0x1c,  0x1e,  0xc0,  0xe8,  0xd4,  0xe4,  0x00,  0xe8,  0xe0,  0xc0,  0x20,  0xf8,  0xe8,  0xf8,  0xf8,  0x48,  0x48,  0x08,  0x38,  0x33,  0x37,  0x1e,  0x07,  0x0f,  0x0d,  0x01,  0x3f,  0x3c,  0x38,  0x11,  0x19,  0x1f,  0x2d,  0x00,  0x58,  0x98,  0xc0,  0x48,  0xc8,  0xc8,  0xc0,  0xe0,  0xc0,  0xe0,  0xe8,  0xa8,  0xe8,  0xd8,  0xd8,  0x00,  0x07,  0x1f,  0x1f,  0x1f,  0x1f,  0x18,  0x07,  0x1f,  0x06,  0x1d,  0x1d,  0x1d,  0x1b,  0x1f,  0x1c,  0x1e,  0xc0,  0xe0,  0xd4,  0xea,  0x0a,  0xe0,  0xe4,  0xc0,  0x20,  0xf0,  0xe4,  0xf4,  0xf4,  0x44,  0x44,  0x04,  0x38,  0x33,  0x37,  0x19,  0x07,  0x0f,  0x0e,  0x0f,  0x3f,  0x3c,  0x3c,  0x16,  0x1e,  0x1f,  0x2e,  0x00,  0x70,  0x9c,  0xcc,  0xc0,  0xc4,  0xc4,  0xc4,  0x00,  0xc4,  0xe0,  0x60,  0x24,  0x64,  0xd4,  0xd4,  0x04,  0x06,  0x4f,  0xaf,  0xaf,  0x0f,  0x57,  0x18,  0x7f,  0x01,  0x47,  0x47,  0x58,  0x5f,  0x4f,  0x5f,  0x3f,  0x60,  0xf0,  0xf0,  0xf0,  0xf0,  0xe8,  0x18,  0xfc,  0x80,  0xe0,  0xe0,  0x18,  0xf8,  0xf0,  0xf8,  0xfc,  0x7f,  0x3f,  0x1f,  0x53,  0x4c,  0x4f,  0x00,  0x00,  0x3f,  0x7f,  0x5f,  0x4f,  0x5f,  0x7f,  0x5f,  0x00,  0xfc,  0xfc,  0xf8,  0xc8,  0x30,  0x00,  0xf0,  0xf0,  0xfc,  0xfc,  0xf8,  0xf0,  0xf8,  0xf8,  0xfc,  0x00,  0x06,  0x0f,  0x4f,  0xaf,  0xaf,  0x17,  0x58,  0x3f,  0x01,  0x07,  0x47,  0x58,  0x5f,  0x4f,  0x5f,  0x7f,  0x60,  0xf0,  0xf0,  0xf0,  0xf0,  0xe8,  0x18,  0xfc,  0x80,  0xe0,  0xe0,  0x18,  0xf8,  0xf0,  0xf8,  0xfc,  0x7f,  0x7f,  0x1f,  0x13,  0x4c,  0x40,  0x4f,  0x0f,  0x3f,  0x3f,  0x5f,  0x4f,  0x5f,  0x5f,  0x7f,  0x40,  0xfc,  0xfc,  0xfe,  0xce,  0x30,  0xf0,  0x00,  0x00,  0xfc,  0xfc,  0xf8,  0xf0,  0xf8,  0xfc,  0xf8,  0x00);
}